

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O0

void __thiscall UtilizationWidget::drawGraph(UtilizationWidget *this)

{
  vector<Point<float>,_std::allocator<Point<float>_>_> *src;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QColor *pQVar5;
  size_type sVar6;
  reference pvVar7;
  int *piVar8;
  ulong uVar9;
  float fVar10;
  PointF local_b8;
  undefined1 local_b0 [8];
  vector<Point<float>,_std::allocator<Point<float>_>_> points;
  int local_90;
  int local_8c;
  vector<Point<float>,_std::allocator<Point<float>_>_> *pvStack_88;
  int count;
  vector<Point<float>,_std::allocator<Point<float>_>_> *gPoints;
  undefined1 auStack_78 [4];
  int g;
  anon_class_32_4_58ce38c5 drawGraph;
  anon_class_4_1_24fd66d6 local_50;
  anon_class_4_1_60e07675 yPos;
  anon_class_4_1_24fd66d6 xPos;
  QPen local_40 [8];
  QPen pen;
  QColor color;
  QSize QStack_1c;
  float graphHeight;
  float local_14;
  UtilizationWidget *pUStack_10;
  float graphWidth;
  UtilizationWidget *this_local;
  
  pUStack_10 = this;
  QStack_1c = QWidget::size(&this->super_QWidget);
  iVar3 = QSize::width(&stack0xffffffffffffffe4);
  local_14 = (float)iVar3;
  color._8_8_ = QWidget::size(&this->super_QWidget);
  iVar3 = QSize::height((QSize *)((long)&color.ct + 4));
  QColor::QColor((QColor *)&pen);
  QPen::QPen(local_40);
  QPen::setWidth((int)local_40);
  local_50.graphWidth = local_14;
  _auStack_78 = &local_50;
  drawGraph.xPos = (anon_class_4_1_24fd66d6 *)((long)&drawGraph.color + 4);
  drawGraph.this = (UtilizationWidget *)&pen;
  drawGraph.yPos = (anon_class_4_1_60e07675 *)this;
  drawGraph.color._4_4_ = (float)iVar3;
  for (gPoints._4_4_ = 0; iVar1 = gPoints._4_4_, iVar4 = InfoProvider::getGPUCount(), iVar1 < iVar4;
      gPoints._4_4_ = gPoints._4_4_ + 1) {
    pQVar5 = SettingsManager::getGPUColor(gPoints._4_4_);
    color._0_6_ = SUB86((ulong)*(undefined8 *)((long)&pQVar5->ct + 2) >> 0x10,0);
    _pen = (undefined6)*(undefined8 *)pQVar5;
    QPen::setColor((QColor *)local_40);
    QPainter::setPen((QPen *)&this->painter);
    pvStack_88 = QVarLengthArray<std::vector<Point<float>,_std::allocator<Point<float>_>_>,_256LL>::
                 operator[](&this->graphPoints,(long)gPoints._4_4_);
    bVar2 = SettingsManager::isSmoothGraph();
    if (bVar2) {
      sVar6 = std::vector<Point<float>,_std::allocator<Point<float>_>_>::size(pvStack_88);
      local_90 = (int)sVar6;
      pvVar7 = std::vector<Point<float>,_std::allocator<Point<float>_>_>::back(pvStack_88);
      fVar10 = pvVar7->x;
      pvVar7 = std::vector<Point<float>,_std::allocator<Point<float>_>_>::front(pvStack_88);
      fVar10 = UtilizationWidget::drawGraph::anon_class_4_1_24fd66d6::operator()
                         (&local_50,fVar10 - pvVar7->x);
      points.super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)(fVar10 / 3.0);
      piVar8 = std::max<int>(&local_90,
                             (int *)((long)&points.
                                            super__Vector_base<Point<float>,_std::allocator<Point<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4))
      ;
      local_8c = *piVar8;
      uVar9 = (ulong)local_8c;
      sVar6 = std::vector<Point<float>,_std::allocator<Point<float>_>_>::size(pvStack_88);
      src = pvStack_88;
      if (sVar6 < uVar9) {
        Point<float>::Point(&local_b8,local_14,(float)iVar3);
        PCHIPInterpolator::getInterpolatedPoints
                  ((vector<Point<float>,_std::allocator<Point<float>_>_> *)local_b0,src,local_b8,
                   local_8c);
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()
                  ((anon_class_32_4_58ce38c5 *)auStack_78,
                   (vector<Point<float>,_std::allocator<Point<float>_>_> *)local_b0);
        std::vector<Point<float>,_std::allocator<Point<float>_>_>::~vector
                  ((vector<Point<float>,_std::allocator<Point<float>_>_> *)local_b0);
      }
      else {
        UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()
                  ((anon_class_32_4_58ce38c5 *)auStack_78,pvStack_88);
      }
    }
    else {
      UtilizationWidget::drawGraph::anon_class_32_4_58ce38c5::operator()
                ((anon_class_32_4_58ce38c5 *)auStack_78,pvStack_88);
    }
  }
  QPen::~QPen(local_40);
  return;
}

Assistant:

void UtilizationWidget::drawGraph() {
    auto graphWidth = static_cast<float>(size().width());
    auto graphHeight = static_cast<float>(size().height());

    QColor color;
    QPen pen;
    pen.setWidth(2);

    auto xPos = [graphWidth](float x) { return x * graphWidth; };
    auto yPos = [graphHeight](float y) { return graphHeight - graphHeight * y; };

    auto drawGraph = [&](const std::vector<PointF> &points) {
        QPainterPath filling;

        auto pointPos = [&](PointF point) -> QPointF {
            return {xPos(point.x), yPos(point.y)};
        };

        filling.moveTo(pointPos(points[0]));

        for (size_t i = 1; i < points.size(); i++)
            filling.lineTo(pointPos(points[i]));

        painter.drawPath(filling);

        filling.lineTo(pointPos({1.0f, 0.0f}));
        filling.lineTo(pointPos({points[0].x, 0.0f}));
        filling.lineTo(pointPos({points[0].x, points[0].y}));

        color.setAlpha(64);
        painter.fillPath(filling, QBrush(color));
    };

    for (int g = 0; g < InfoProvider::getGPUCount(); g++) {
        color = SettingsManager::getGPUColor(g);
        pen.setColor(color);
        painter.setPen(pen);

        auto &gPoints = graphPoints[g];

        if (SettingsManager::isSmoothGraph()) {
            int count = std::max(
                static_cast<int>(gPoints.size()),
                static_cast<int>(xPos(gPoints.back().x - gPoints.front().x) / 3)
            );

            if (count > gPoints.size()) {
                auto points = PCHIPInterpolator::getInterpolatedPoints(gPoints, {graphWidth, graphHeight}, count);
                drawGraph(points);
            } else {
                drawGraph(gPoints);
            }
        } else {
            drawGraph(gPoints);
        }
    }
}